

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

bool __thiscall Board::load(Board *this,string *path)

{
  _Alloc_hider _Var1;
  long lVar2;
  bool bVar3;
  value_type local_2a0;
  string buffer;
  vector<Tile,_std::allocator<Tile>_> tiles;
  regex nonNumeric;
  ifstream stream;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&stream,(string *)path,_S_in);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(_stream + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&stream,_S_beg);
    std::istream::tellg();
    std::__cxx11::string::resize((ulong)&buffer);
    std::istream::seekg(&stream,0,0);
    std::istream::read((char *)&stream,(long)buffer._M_dataplus._M_p);
    std::ifstream::close();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&nonNumeric,"[^0-9]",0x10);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tiles,&buffer,
               &nonNumeric,"",0);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&tiles);
    std::__cxx11::string::~string((string *)&tiles);
    _Var1 = buffer._M_dataplus;
    bVar3 = buffer._M_string_length == 0x51;
    if (bVar3) {
      tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      for (lVar2 = 0; lVar2 != 0x51; lVar2 = lVar2 + 1) {
        local_2a0.value = (int)_Var1._M_p[lVar2] - 0x30;
        local_2a0.status = (TileStatus)(local_2a0.value != Empty);
        std::vector<Tile,_std::allocator<Tile>_>::push_back(&tiles,&local_2a0);
      }
      std::vector<Tile,_std::allocator<Tile>_>::operator=(&this->_tiles,&tiles);
      std::_Vector_base<Tile,_std::allocator<Tile>_>::~_Vector_base
                (&tiles.super__Vector_base<Tile,_std::allocator<Tile>_>);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&nonNumeric);
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&buffer);
  std::ifstream::~ifstream(&stream);
  return bVar3;
}

Assistant:

bool Board::load(const std::string &path)
{
	std::ifstream stream(path);
	std::string buffer;

	if (!stream)
		return false;

	stream.seekg(0, std::ios::end);
	buffer.resize(stream.tellg());
	stream.seekg(0);
	stream.read(&buffer[0], buffer.size());
	stream.close();

	std::regex nonNumeric("[^0-9]");

	buffer = std::regex_replace(buffer, nonNumeric, "");

	if (buffer.size() != 81)
		return false;

	std::vector<Tile> tiles;

	for (auto &c : buffer)
	{
		auto t = Tile{};
		t.value = (TileValue)(c - '0');

		if (t.value == TileValue::Empty)
			t.status = TileStatus::Empty;
		else
			t.status = TileStatus::Solved;

		tiles.push_back(t);
	}

	_tiles = tiles;
	return true;
}